

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

void Sbd_ManDerive_rec(Gia_Man_t *pNew,Gia_Man_t *p,int Node,Vec_Int_t *vMirrors)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  if ((-1 < Node) && (Node < vMirrors->nSize)) {
    uVar5 = (uint)vMirrors->pArray[(uint)Node] >> 1;
    if (vMirrors->pArray[(uint)Node] < 0) {
      uVar5 = Node;
    }
    if (((int)uVar5 < 0) || (p->nObjs <= (int)uVar5)) {
LAB_0053e148:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar1 = p->pObjs + uVar5;
    if (pGVar1->Value == 0xffffffff) {
      uVar3 = (uint)*(ulong *)pGVar1;
      if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                      ,0x7e2,"void Sbd_ManDerive_rec(Gia_Man_t *, Gia_Man_t *, int, Vec_Int_t *)");
      }
      Sbd_ManDerive_rec(pNew,p,uVar5 - (uVar3 & 0x1fffffff),vMirrors);
      Sbd_ManDerive_rec(pNew,p,uVar5 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),vMirrors);
      uVar2 = *(ulong *)pGVar1;
      uVar4 = uVar2 & 0x1fffffff;
      uVar3 = (uint)(uVar2 >> 0x20);
      if ((uVar4 == 0x1fffffff || (int)(uint)uVar2 < 0) ||
         ((uVar3 & 0x1fffffff) <= ((uint)uVar2 & 0x1fffffff))) {
        if (((int)pGVar1[-uVar4].Value < 0) || ((int)pGVar1[-(ulong)(uVar3 & 0x1fffffff)].Value < 0)
           ) goto LAB_0053e167;
        uVar3 = Gia_ManHashAnd(pNew,pGVar1[-uVar4].Value ^ (uint)(uVar2 >> 0x1d) & 1,
                               pGVar1[-(ulong)(uVar3 & 0x1fffffff)].Value ^ uVar3 >> 0x1d & 1);
      }
      else {
        if (((int)pGVar1[-uVar4].Value < 0) || ((int)pGVar1[-(ulong)(uVar3 & 0x1fffffff)].Value < 0)
           ) goto LAB_0053e167;
        uVar3 = Gia_ManHashXorReal(pNew,pGVar1[-uVar4].Value ^ (uint)(uVar2 >> 0x1d) & 1,
                                   pGVar1[-(ulong)(uVar3 & 0x1fffffff)].Value ^ uVar3 >> 0x1d & 1);
      }
      pGVar1->Value = uVar3;
    }
    if (uVar5 != Node) {
      if (vMirrors->nSize <= Node) goto LAB_0053e129;
      if (vMirrors->pArray[(uint)Node] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      if ((int)pGVar1->Value < 0) {
LAB_0053e167:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      if (p->nObjs <= Node) goto LAB_0053e148;
      p->pObjs[(uint)Node].Value = vMirrors->pArray[(uint)Node] & 1U ^ pGVar1->Value;
    }
    return;
  }
LAB_0053e129:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sbd_ManDerive_rec( Gia_Man_t * pNew, Gia_Man_t * p, int Node, Vec_Int_t * vMirrors )
{
    Gia_Obj_t * pObj;
    int Obj = Node;
    if ( Vec_IntEntry(vMirrors, Node) >= 0 )
        Obj = Abc_Lit2Var( Vec_IntEntry(vMirrors, Node) );
    pObj = Gia_ManObj( p, Obj );
    if ( !~pObj->Value )
    {
        assert( Gia_ObjIsAnd(pObj) );
        Sbd_ManDerive_rec( pNew, p, Gia_ObjFaninId0(pObj, Obj), vMirrors );
        Sbd_ManDerive_rec( pNew, p, Gia_ObjFaninId1(pObj, Obj), vMirrors );
        if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    // set the original node as well
    if ( Obj != Node )
        Gia_ManObj(p, Node)->Value = Abc_LitNotCond( pObj->Value, Abc_LitIsCompl(Vec_IntEntry(vMirrors, Node)) );
}